

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.hpp
# Opt level: O1

void __thiscall
cpptrace::exception_with_message::~exception_with_message(exception_with_message *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_lazy_exception).super_exception = (exception)&PTR__exception_with_message_00227298;
  pcVar2 = (this->user_message)._M_dataplus._M_p;
  paVar1 = &(this->user_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_lazy_exception).super_exception = (exception)&PTR__lazy_exception_00227260;
  pcVar2 = (this->super_lazy_exception).what_string._M_dataplus._M_p;
  paVar1 = &(this->super_lazy_exception).what_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  detail::lazy_trace_holder::clear(&(this->super_lazy_exception).trace_holder);
  std::exception::~exception((exception *)this);
  return;
}

Assistant:

class CPPTRACE_EXPORT exception_with_message : public lazy_exception {
        mutable std::string user_message;

    public:
        explicit exception_with_message(
            std::string&& message_arg,
            raw_trace&& trace = detail::get_raw_trace_and_absorb()
        ) noexcept : lazy_exception(std::move(trace)), user_message(std::move(message_arg)) {}

        const char* message() const noexcept override;
    }